

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O2

bool __thiscall
MultiAgentDecisionProcessDiscrete::SetInitialized(MultiAgentDecisionProcessDiscrete *this,bool b)

{
  bool bVar1;
  bool bVar2;
  E *this_00;
  bool bVar3;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,b) == 0) {
    bVar3 = false;
    MADPComponentDiscreteActions::SetInitialized(&this->_m_A,false);
    MADPComponentDiscreteObservations::SetInitialized(&this->_m_O,false);
    MADPComponentDiscreteStates::SetInitialized(&this->_m_S,false);
  }
  else {
    bVar1 = MADPComponentDiscreteActions::SetInitialized(&this->_m_A,true);
    bVar2 = false;
    bVar3 = false;
    if (!bVar1) goto LAB_004a9135;
    bVar1 = MADPComponentDiscreteObservations::SetInitialized(&this->_m_O,true);
    bVar2 = false;
    bVar3 = false;
    if (!bVar1) goto LAB_004a9135;
    bVar1 = MADPComponentDiscreteStates::SetInitialized(&this->_m_S,true);
    bVar2 = false;
    bVar3 = false;
    if (!bVar1) goto LAB_004a9135;
    if (this->_m_p_tModel == (TransitionModelDiscrete *)0x0) {
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,
           "MultiAgentDecisionProcessDiscrete::SetInitialized() -initializing a MultiAgentDecisionProcessDiscrete which has no transition model! - make sure that CreateNewTransitionModel() has been called before SetInitialized()"
          );
LAB_004a9177:
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
    if (this->_m_p_oModel == (ObservationModelDiscrete *)0x0) {
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,
           "MultiAgentDecisionProcessDiscrete::SetInitialized() -initializing a MultiAgentDecisionProcessDiscrete which has no observation model! - make sure that CreateNewObservationModel() has been called before SetInitialized()"
          );
      goto LAB_004a9177;
    }
    SanityCheck(this);
    bVar3 = true;
  }
  bVar2 = true;
LAB_004a9135:
  this->_m_initialized = bVar3;
  return bVar2;
}

Assistant:

bool MultiAgentDecisionProcessDiscrete::SetInitialized(bool b)
{

    if(b == true)
    {
        if(     !_m_A.SetInitialized(b)
            ||  !_m_O.SetInitialized(b)
            ||  !_m_S.SetInitialized(b) )
        {
            //error in initialization of sub-components.
            _m_initialized = false;
            return(false);
        }
        //check if transition- and observation model are present...
        if(_m_p_tModel == 0)
        {
            throw E("MultiAgentDecisionProcessDiscrete::SetInitialized() -initializing a MultiAgentDecisionProcessDiscrete which has no transition model! - make sure that CreateNewTransitionModel() has been called before SetInitialized()");
        }
        if(_m_p_oModel == 0)
        {
            throw E("MultiAgentDecisionProcessDiscrete::SetInitialized() -initializing a MultiAgentDecisionProcessDiscrete which has no observation model! - make sure that CreateNewObservationModel() has been called before SetInitialized()");

        }

        if( SanityCheck() )
        {
            _m_initialized = true;
            return(true);
        }
        else
        {
            _m_initialized = false;
            return(false);
        }
    }
    else
    {
        _m_A.SetInitialized(b);
        _m_O.SetInitialized(b);
        _m_S.SetInitialized(b); 
        _m_initialized = false;
        return(true);
    }

}